

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_recv(nng_socket s,void *buf,size_t *szp,int flags)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  nni_msg *local_40;
  nng_msg *msg;
  
  iVar2 = nng_recvmsg(s,&local_40,flags);
  if (iVar2 == 0) {
    msg = (nng_msg *)nni_msg_body(local_40);
    uVar1 = *szp;
    sVar3 = nni_msg_len(local_40);
    if (sVar3 < uVar1) {
      sVar3 = nni_msg_len(local_40);
    }
    else {
      sVar3 = *szp;
    }
    memcpy(buf,msg,sVar3);
    sVar3 = nni_msg_len(local_40);
    *szp = sVar3;
    nni_msg_free(local_40);
  }
  return iVar2;
}

Assistant:

int
nng_recv(nng_socket s, void *buf, size_t *szp, int flags)
{
	nng_msg *msg;
	int      rv;

	// Note that while it would be nice to make this a zero copy operation,
	// its not normally possible if a size was specified.
	if ((rv = nng_recvmsg(s, &msg, flags)) != 0) {
		return (rv);
	}
	memcpy(buf, nng_msg_body(msg),
	    *szp > nng_msg_len(msg) ? nng_msg_len(msg) : *szp);
	*szp = nng_msg_len(msg);
	nni_msg_free(msg);
	return (0);
}